

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::Functions::GetComponent<tcu::Vector<float,_4>_>::print
          (GetComponent<tcu::Vector<float,_4>_> *this,ostream *os,BaseArgExprs *args)

{
  const_reference ppEVar1;
  ostream *poVar2;
  BaseArgExprs *args_local;
  ostream *os_local;
  GetComponent<tcu::Vector<float,_4>_> *this_local;
  
  ppEVar1 = std::
            vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
            ::operator[](args,0);
  poVar2 = shaderexecutor::operator<<(os,*ppEVar1);
  poVar2 = std::operator<<(poVar2,"[");
  ppEVar1 = std::
            vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
            ::operator[](args,1);
  poVar2 = shaderexecutor::operator<<(poVar2,*ppEVar1);
  std::operator<<(poVar2,"]");
  return;
}

Assistant:

void		print		(ostream&				os,
							 const BaseArgExprs&	args) const
	{
		os << *args[0] << "[" << *args[1] << "]";
	}